

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O1

CURLcode Curl_wildcard_init(WildcardData *wc)

{
  CURLcode CVar1;
  curl_llist *pcVar2;
  
  pcVar2 = Curl_llist_alloc(Curl_fileinfo_dtor);
  wc->filelist = pcVar2;
  CVar1 = CURLE_OUT_OF_MEMORY;
  if (pcVar2 != (curl_llist *)0x0) {
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_wildcard_init(struct WildcardData *wc)
{
  DEBUGASSERT(wc->filelist == NULL);
  /* now allocate only wc->filelist, everything else
     will be allocated if it is needed. */
  wc->filelist = Curl_llist_alloc(Curl_fileinfo_dtor);
  if(!wc->filelist) {;
    return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}